

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Mat *this_00;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  Allocator *pAVar11;
  int y;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int y_40;
  uint uVar17;
  void *pvVar18;
  void *pvVar19;
  int z;
  uint uVar20;
  uint uVar21;
  void *pvVar22;
  long lVar23;
  pointer pMVar24;
  ulong uVar25;
  pointer a;
  int i;
  int i_2;
  int i_8;
  int i_4;
  int x_5;
  uint uVar26;
  void *pvVar27;
  int y_1;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  int x_49;
  void *pvVar31;
  int y_3;
  uint uVar32;
  void *pvVar33;
  ulong uVar34;
  float fVar35;
  float fVar36;
  void *local_98;
  void *local_70;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar1 = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    if (a->dims - 1U < 4) {
      uVar21 = a->w;
      lVar23 = (long)(int)uVar21;
      uVar20 = a->h;
      uVar13 = a->d;
      uVar2 = a->c;
      uVar14 = (ulong)uVar2;
      uVar26 = uVar20 * uVar21 * uVar13;
      uVar16 = (ulong)uVar26;
      sVar5 = a->elemsize;
      uVar3 = a[1].w;
      lVar28 = (long)(int)uVar3;
      uVar32 = a[1].h;
      uVar17 = a[1].d;
      uVar4 = a[1].c;
      uVar34 = (ulong)uVar4;
      uVar15 = uVar32 * uVar3 * uVar17;
      uVar25 = (ulong)uVar15;
      switch(a->dims) {
      case 1:
        iVar12 = a[1].dims + -1;
        if (uVar21 == 1) {
          switch(iVar12) {
          case 0:
            Mat::create(this_00,uVar3,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              *(float *)((long)pvVar18 + uVar34 * 4) =
                   *(float *)((long)pvVar22 + uVar34 * 4) + fVar35;
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
              *(float *)((long)pvVar18 + uVar14 * 4) =
                   *(float *)((long)pvVar22 + uVar14 * 4) + fVar35;
            }
            break;
          case 2:
            Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar22 + uVar16 * 4) + fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            break;
          case 3:
            Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar22 + uVar16 * 4) + fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
        }
        else {
          switch(iVar12) {
          case 0:
            Mat::create(this_00,uVar21,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (a[1].w == 1) {
              pvVar22 = a->data;
              fVar35 = *a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                *(float *)((long)pvVar18 + uVar34 * 4) =
                     *(float *)((long)pvVar22 + uVar34 * 4) + fVar35;
              }
            }
            else {
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                *(float *)((long)pvVar18 + uVar34 * 4) =
                     *(float *)((long)pvVar19 + uVar34 * 4) + *(float *)((long)pvVar22 + uVar34 * 4)
                ;
              }
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar34 * 4);
              for (uVar25 = 0; uVar14 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + uVar25 * 4) + fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            }
            break;
          case 2:
            Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) + fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            break;
          case 3:
            Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) + fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
          }
        }
        break;
      case 2:
        pAVar11 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if (pvVar18 != (void *)0x0) {
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 != 0) {
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              iVar12 = a->w;
              sVar6 = a->elemsize;
              sVar7 = a[1].elemsize;
              uVar14 = 0;
              if (0 < (int)uVar3) {
                uVar14 = (ulong)uVar3;
              }
              if ((int)uVar32 < 1) {
                uVar32 = 0;
              }
              if ((int)uVar4 < 1) {
                uVar34 = 0;
              }
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
                pvVar27 = pvVar19;
                pvVar31 = pvVar18;
                for (uVar16 = 0; uVar16 != uVar32; uVar16 = uVar16 + 1) {
                  fVar35 = *(float *)((long)pvVar22 + uVar16 * 4 + (long)iVar12 * sVar6 * uVar25);
                  for (uVar30 = 0; uVar14 != uVar30; uVar30 = uVar30 + 1) {
                    *(float *)((long)pvVar31 + uVar30 * 4) =
                         *(float *)((long)pvVar27 + uVar30 * 4) + fVar35;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
                pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              }
              return 0;
            }
            return -100;
          }
        }
        else if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if (pvVar18 != (void *)0x0) {
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 != 0) {
              iVar12 = a->w;
              sVar6 = a->elemsize;
              sVar7 = a[1].elemsize;
              sVar8 = a[1].cstep;
              pvVar22 = a->data;
              sVar9 = this_00->elemsize;
              uVar14 = 0;
              if (0 < (int)uVar3) {
                uVar14 = (ulong)uVar3;
              }
              pvVar19 = a[1].data;
              if ((int)uVar32 < 1) {
                uVar32 = 0;
              }
              uVar25 = (ulong)uVar17;
              if ((int)uVar17 < 1) {
                uVar25 = 0;
              }
              if ((int)uVar4 < 1) {
                uVar34 = 0;
              }
              for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
                pvVar27 = (void *)(sVar7 * sVar8 * uVar16 + (long)pvVar19);
                pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
                for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                  fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar6 * uVar16);
                  for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                    for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                      *(float *)((long)pvVar31 + uVar29 * 4) =
                           *(float *)((long)pvVar27 + uVar29 * 4) + fVar35;
                    }
                    pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                    pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                  }
                }
              }
              return 0;
            }
            return -100;
          }
        }
        else {
          Mat::create(this_00,uVar21,uVar20,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if ((pvVar18 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if (a[1].dims != 1) {
              if (a[1].dims == 2) {
                pvVar22 = a->data;
                pvVar19 = a[1].data;
                uVar14 = 0;
                if ((int)uVar26 < 1) {
                  uVar16 = 0;
                }
                for (; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar18 + uVar14 * 4) =
                       *(float *)((long)pvVar19 + uVar14 * 4) +
                       *(float *)((long)pvVar22 + uVar14 * 4);
                }
                return 0;
              }
              return 0;
            }
            Mat::create(this_00,uVar21,uVar20,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (a[1].w == 1) {
                pvVar22 = a->data;
                fVar35 = *a[1].data;
                if ((int)uVar26 < 1) {
                  uVar16 = 0;
                }
                for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar18 + uVar14 * 4) =
                       *(float *)((long)pvVar22 + uVar14 * 4) + fVar35;
                }
                return 0;
              }
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              uVar34 = (ulong)uVar20;
              if ((int)uVar20 < 1) {
                uVar34 = 0;
              }
              for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)((long)pvVar18 + uVar16 * 4) =
                       *(float *)((long)pvVar22 + uVar16 * 4) + fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + lVar23 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar23 * 4);
              }
              return 0;
            }
            return -100;
          }
        }
        return -100;
      case 3:
        if (a[1].dims == 3) {
          uVar13 = uVar4 ^ uVar2;
          if ((uVar32 == 1 && uVar3 == 1) && uVar13 == 0) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            pvVar19 = a[1].data;
            sVar9 = this_00->elemsize;
            uVar34 = 0;
            if ((int)uVar26 < 1) {
              uVar16 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar10 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + sVar7 * sVar8 * uVar34) +
                     *(float *)((long)pvVar22 + uVar25 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if ((uVar3 == uVar21) && (uVar4 == 1 && uVar32 == uVar20)) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            pvVar19 = a[1].data;
            sVar7 = this_00->elemsize;
            uVar34 = 0;
            if ((int)uVar26 < 1) {
              uVar16 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar8 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + uVar25 * 4) + *(float *)((long)pvVar22 + uVar25 * 4)
                ;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar8);
            }
          }
          else if ((uVar20 == 1 && uVar21 == 1) && uVar13 == 0) {
            Mat::create(this_00,uVar3,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            uVar34 = 0;
            if ((int)uVar15 < 1) {
              uVar25 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar10 = a[1].cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) +
                     *(float *)((long)pvVar22 + sVar6 * sVar7 * uVar34);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
            }
          }
          else if ((uVar3 == uVar21) && (uVar2 == 1 && uVar32 == uVar20)) {
            Mat::create(this_00,uVar21,uVar20,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            sVar6 = a[1].elemsize;
            sVar7 = this_00->elemsize;
            uVar14 = 0;
            if ((int)uVar15 < 1) {
              uVar25 = uVar14;
            }
            if ((int)uVar4 < 1) {
              uVar34 = uVar14;
            }
            sVar8 = a[1].cstep;
            for (; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) + *(float *)((long)pvVar22 + uVar16 * 4)
                ;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
              pvVar19 = (void *)((long)pvVar19 + sVar6 * sVar8);
            }
          }
          else if (((uVar32 == uVar20 && uVar3 == 1) && uVar13 == 0) && uVar21 != 1) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar21) {
              uVar25 = (ulong)uVar21;
            }
            uVar16 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar16 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar9 = this_00->elemsize;
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + sVar7 * sVar8 * uVar34);
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar27 + uVar29 * 4) + fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if (((uVar32 == 1 && uVar21 == uVar3) && uVar13 == 0) && uVar20 != 1) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar21) {
              uVar25 = (ulong)uVar21;
            }
            sVar6 = a->elemsize;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)((long)pvVar31 + uVar16 * 4) =
                       *(float *)((long)pvVar19 + uVar16 * 4) +
                       *(float *)((long)pvVar27 + uVar16 * 4);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if (((uVar21 == 1 && uVar20 == uVar32) && uVar13 == 0) && uVar3 != 1) {
            Mat::create(this_00,uVar3,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar19 = a[1].data;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar3) {
              uVar25 = (ulong)uVar3;
            }
            uVar16 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar16 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + sVar6 * sVar7 * uVar34);
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar27 + uVar29 * 4) + fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
            }
          }
          else if (((uVar21 == uVar3 && uVar20 == 1) && uVar13 == 0) && uVar32 != 1) {
            Mat::create(this_00,uVar21,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar21) {
              uVar25 = (ulong)uVar21;
            }
            sVar6 = a->elemsize;
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)((long)pvVar31 + uVar16 * 4) =
                       *(float *)((long)pvVar27 + uVar16 * 4) +
                       *(float *)((long)pvVar22 + uVar16 * 4);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            pvVar19 = a[1].data;
            sVar7 = this_00->elemsize;
            uVar34 = 0;
            if ((int)uVar26 < 1) {
              uVar16 = uVar34;
            }
            sVar8 = a[1].elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + uVar25 * 4) + *(float *)((long)pvVar22 + uVar25 * 4)
                ;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
        }
        else if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar22 = a->data;
          sVar10 = this_00->elemsize;
          uVar14 = 0;
          uVar25 = 0;
          if (0 < (int)uVar3) {
            uVar25 = (ulong)uVar3;
          }
          uVar16 = 0;
          if (0 < (int)uVar32) {
            uVar16 = (ulong)uVar32;
          }
          pvVar19 = a[1].data;
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar34 = uVar14;
          }
          for (; uVar14 != uVar34; uVar14 = uVar14 + 1) {
            pvVar27 = (void *)(sVar6 * sVar7 * uVar14 + (long)pvVar22);
            pvVar33 = (void *)(sVar8 * sVar9 * uVar14 + (long)pvVar19);
            pvVar31 = (void *)(sVar5 * sVar10 * uVar14 + (long)pvVar18);
            for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
              for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar33 + uVar29 * 4) + fVar35;
                }
                pvVar33 = (void *)((long)pvVar33 + lVar28 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              }
              pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar32 * 4);
            }
          }
        }
        else {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          if (a[1].dims == 1) {
            if (a[1].w == 1) {
              fVar35 = *a[1].data;
              pvVar22 = a->data;
              sVar6 = a->elemsize;
              sVar7 = this_00->elemsize;
              uVar34 = 0;
              if ((int)uVar26 < 1) {
                uVar16 = uVar34;
              }
              if ((int)uVar2 < 1) {
                uVar14 = uVar34;
              }
              sVar8 = a->cstep;
              for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) + fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
                pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar8);
              }
            }
            else {
              pvVar22 = a->data;
              sVar6 = a->elemsize;
              pvVar19 = a[1].data;
              sVar7 = this_00->elemsize;
              uVar34 = 0;
              if ((int)uVar26 < 1) {
                uVar16 = uVar34;
              }
              if ((int)uVar2 < 1) {
                uVar14 = uVar34;
              }
              sVar8 = a->cstep;
              for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) + fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
                pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar8);
              }
            }
          }
          else {
            if (a[1].dims != 2) {
              return 0;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            iVar12 = a[1].w;
            sVar7 = a[1].elemsize;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar21) {
              uVar25 = (ulong)uVar21;
            }
            uVar16 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar16 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            sVar8 = this_00->elemsize;
            pvVar19 = a[1].data;
            sVar9 = a->cstep;
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar7 * uVar34);
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar27 + uVar29 * 4) + fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar9);
            }
          }
        }
        break;
      case 4:
        iVar12 = a[1].dims;
        Mat::create(this_00,uVar21,uVar20,uVar13,uVar2,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (iVar12 == 4) {
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          pvVar19 = a[1].data;
          sVar7 = this_00->elemsize;
          uVar34 = 0;
          if ((int)uVar26 < 1) {
            uVar16 = uVar34;
          }
          sVar8 = a[1].elemsize;
          if ((int)uVar2 < 1) {
            uVar14 = uVar34;
          }
          sVar9 = a[1].cstep;
          sVar10 = a->cstep;
          for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar18 + uVar25 * 4) =
                   *(float *)((long)pvVar19 + uVar25 * 4) + *(float *)((long)pvVar22 + uVar25 * 4);
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
            pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
          }
        }
        else {
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          iVar12 = a[1].dims;
          if (iVar12 == 1) {
            if (a[1].w == 1) {
              fVar35 = *a[1].data;
              pvVar22 = a->data;
              sVar6 = a->elemsize;
              sVar7 = this_00->elemsize;
              uVar34 = 0;
              if ((int)uVar26 < 1) {
                uVar16 = uVar34;
              }
              if ((int)uVar2 < 1) {
                uVar14 = uVar34;
              }
              sVar8 = a->cstep;
              for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) + fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
                pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar8);
              }
            }
            else {
              pvVar22 = a->data;
              sVar6 = a->elemsize;
              pvVar19 = a[1].data;
              sVar7 = this_00->elemsize;
              uVar34 = 0;
              if ((int)uVar26 < 1) {
                uVar16 = uVar34;
              }
              if ((int)uVar2 < 1) {
                uVar14 = uVar34;
              }
              sVar8 = a->cstep;
              for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) + fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar7);
                pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar8);
              }
            }
          }
          else if (iVar12 == 3) {
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            pvVar22 = a->data;
            sVar10 = this_00->elemsize;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar21) {
              uVar25 = (ulong)uVar21;
            }
            uVar16 = 0;
            if (0 < (int)uVar20) {
              uVar16 = (ulong)uVar20;
            }
            pvVar19 = a[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar31 = (void *)(sVar6 * sVar7 * uVar34 + (long)pvVar22);
              pvVar27 = (void *)(sVar8 * sVar9 * uVar34 + (long)pvVar19);
              pvVar33 = (void *)(sVar5 * sVar10 * uVar34 + (long)pvVar18);
              for (uVar21 = 0; uVar21 != uVar13; uVar21 = uVar21 + 1) {
                for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                  fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                  for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                    *(float *)((long)pvVar33 + uVar29 * 4) =
                         *(float *)((long)pvVar31 + uVar29 * 4) + fVar35;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                  pvVar33 = (void *)((long)pvVar33 + lVar23 * 4);
                }
                pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar20 * 4);
              }
            }
          }
          else {
            if (iVar12 != 2) {
              return 0;
            }
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            iVar12 = a[1].w;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            uVar34 = 0;
            uVar25 = 0;
            if (0 < (int)uVar21) {
              uVar25 = (ulong)uVar21;
            }
            pvVar22 = a->data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            pvVar19 = a[1].data;
            uVar16 = (ulong)uVar13;
            if ((int)uVar13 < 1) {
              uVar16 = uVar34;
            }
            if ((int)uVar2 < 1) {
              uVar14 = uVar34;
            }
            for (; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              pvVar27 = (void *)(sVar6 * sVar7 * uVar34 + (long)pvVar22);
              pvVar31 = (void *)(sVar5 * sVar9 * uVar34 + (long)pvVar18);
              for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar8 * uVar34);
                for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                  for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                    *(float *)((long)pvVar31 + uVar29 * 4) =
                         *(float *)((long)pvVar27 + uVar29 * 4) + fVar35;
                  }
                  pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                  pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                }
              }
            }
          }
        }
      }
    }
    break;
  case 1:
    pMVar24 = pMVar1;
    goto LAB_00364679;
  case 2:
    if (a->dims - 1U < 4) {
      uVar21 = a->w;
      lVar23 = (long)(int)uVar21;
      uVar20 = a->h;
      uVar13 = a->d;
      uVar2 = a->c;
      uVar14 = (ulong)uVar2;
      uVar26 = uVar20 * uVar21 * uVar13;
      uVar16 = (ulong)uVar26;
      sVar5 = a->elemsize;
      uVar3 = a[1].w;
      lVar28 = (long)(int)uVar3;
      uVar32 = a[1].h;
      uVar17 = a[1].d;
      uVar4 = a[1].c;
      uVar34 = (ulong)uVar4;
      uVar15 = uVar32 * uVar3 * uVar17;
      uVar25 = (ulong)uVar15;
      switch(a->dims) {
      case 1:
        iVar12 = a[1].dims + -1;
        if (uVar21 == 1) {
          switch(iVar12) {
          case 0:
            Mat::create(this_00,uVar3,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              *(float *)((long)pvVar18 + uVar34 * 4) =
                   *(float *)((long)pvVar22 + uVar34 * 4) * fVar35;
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
              *(float *)((long)pvVar18 + uVar14 * 4) =
                   *(float *)((long)pvVar22 + uVar14 * 4) * fVar35;
            }
            break;
          case 2:
            Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar22 + uVar16 * 4) * fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            break;
          case 3:
            Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar22 + uVar16 * 4) * fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
        }
        else {
          switch(iVar12) {
          case 0:
            Mat::create(this_00,uVar21,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (a[1].w == 1) {
              pvVar22 = a->data;
              fVar35 = *a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                *(float *)((long)pvVar18 + uVar34 * 4) =
                     *(float *)((long)pvVar22 + uVar34 * 4) * fVar35;
              }
            }
            else {
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                *(float *)((long)pvVar18 + uVar34 * 4) =
                     *(float *)((long)pvVar19 + uVar34 * 4) * *(float *)((long)pvVar22 + uVar34 * 4)
                ;
              }
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar34 * 4);
              for (uVar25 = 0; uVar14 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + uVar25 * 4) * fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            }
            break;
          case 2:
            Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) * fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            break;
          case 3:
            Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) * fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
          }
        }
        break;
      case 2:
        pAVar11 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            iVar12 = a->w;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar16 = 0; uVar16 != uVar32; uVar16 = uVar16 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar16 * 4 + (long)iVar12 * sVar6 * uVar25);
                for (uVar30 = 0; uVar14 != uVar30; uVar30 = uVar30 + 1) {
                  *(float *)((long)pvVar31 + uVar30 * 4) =
                       *(float *)((long)pvVar27 + uVar30 * 4) * fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            iVar12 = a->w;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            pvVar22 = a->data;
            sVar9 = this_00->elemsize;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            pvVar19 = a[1].data;
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            uVar25 = (ulong)uVar17;
            if ((int)uVar17 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
              pvVar27 = (void *)(sVar7 * sVar8 * uVar16 + (long)pvVar19);
              pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar6 * uVar16);
                for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                  for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                    *(float *)((long)pvVar31 + uVar29 * 4) =
                         *(float *)((long)pvVar27 + uVar29 * 4) * fVar35;
                  }
                  pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
              }
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar21,uVar20,sVar5,pAVar11);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims != 1) {
          if (a[1].dims == 2) {
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
              *(float *)((long)pvVar18 + uVar14 * 4) =
                   *(float *)((long)pvVar19 + uVar14 * 4) * *(float *)((long)pvVar22 + uVar14 * 4);
            }
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar21,uVar20,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (a[1].w == 1) {
            pvVar22 = a->data;
            fVar35 = *a[1].data;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
              *(float *)((long)pvVar18 + uVar14 * 4) =
                   *(float *)((long)pvVar22 + uVar14 * 4) * fVar35;
            }
            return 0;
          }
          pvVar22 = a->data;
          pvVar19 = a[1].data;
          uVar14 = 0;
          if (0 < (int)uVar21) {
            uVar14 = (ulong)uVar21;
          }
          uVar34 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar34 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
            fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
            for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)((long)pvVar18 + uVar16 * 4) =
                   *(float *)((long)pvVar22 + uVar16 * 4) * fVar35;
            }
            pvVar18 = (void *)((long)pvVar18 + lVar23 * 4);
            pvVar22 = (void *)((long)pvVar22 + lVar23 * 4);
          }
          return 0;
        }
        return -100;
      case 3:
        if (a[1].dims == 3) {
          uVar13 = uVar4 ^ uVar2;
          if ((uVar32 == 1 && uVar3 == 1) && uVar13 == 0) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a[1].elemsize;
            sVar7 = a[1].cstep;
            sVar8 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            sVar9 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + sVar6 * sVar7 * uVar34) *
                     *(float *)((long)pvVar22 + uVar25 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar10);
            }
          }
          else if ((uVar3 == uVar21) && (uVar4 == 1 && uVar32 == uVar20)) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            sVar7 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            pvVar19 = a[1].data;
            sVar8 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + uVar25 * 4) * *(float *)((long)pvVar22 + uVar25 * 4)
                ;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
          else if ((uVar20 == 1 && uVar21 == 1) && uVar13 == 0) {
            Mat::create(this_00,uVar3,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            sVar8 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) *
                     *(float *)((long)pvVar22 + sVar6 * sVar7 * uVar34);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
            }
          }
          else if ((uVar3 == uVar21) && (uVar2 == 1 && uVar32 == uVar20)) {
            Mat::create(this_00,uVar21,uVar20,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar18 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) * *(float *)((long)pvVar22 + uVar16 * 4)
                ;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
          }
          else if (((uVar32 == uVar20 && uVar3 == 1) && uVar13 == 0) && uVar21 != 1) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            uVar25 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + sVar7 * sVar8 * uVar16);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar27 + uVar29 * 4) * fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if (((uVar32 == 1 && uVar21 == uVar3) && uVar13 == 0) && uVar20 != 1) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            pvVar19 = a[1].data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            sVar7 = a[1].elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)((long)pvVar31 + uVar16 * 4) =
                       *(float *)((long)pvVar19 + uVar16 * 4) *
                       *(float *)((long)pvVar27 + uVar16 * 4);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if (((uVar21 == 1 && uVar20 == uVar32) && uVar13 == 0) && uVar3 != 1) {
            Mat::create(this_00,uVar3,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            uVar34 = 0;
            if (0 < (int)uVar3) {
              uVar34 = (ulong)uVar3;
            }
            uVar25 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + sVar6 * sVar7 * uVar16);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar27 + uVar29 * 4) * fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
            }
          }
          else if (((uVar21 == uVar3 && uVar20 == 1) && uVar13 == 0) && uVar32 != 1) {
            Mat::create(this_00,uVar21,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            pvVar19 = a[1].data;
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            sVar7 = a[1].elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)((long)pvVar31 + uVar16 * 4) =
                       *(float *)((long)pvVar27 + uVar16 * 4) *
                       *(float *)((long)pvVar22 + uVar16 * 4);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = a[1].cstep;
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                *(float *)((long)pvVar18 + uVar25 * 4) =
                     *(float *)((long)pvVar19 + uVar25 * 4) * *(float *)((long)pvVar22 + uVar25 * 4)
                ;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
        }
        else if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          pvVar22 = a->data;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar19 = a[1].data;
          sVar10 = this_00->elemsize;
          uVar14 = 0;
          if (0 < (int)uVar3) {
            uVar14 = (ulong)uVar3;
          }
          uVar25 = 0;
          if (0 < (int)uVar32) {
            uVar25 = (ulong)uVar32;
          }
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar34 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
            pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
            pvVar33 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
            pvVar31 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
            for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar33 + uVar29 * 4) * fVar35;
                }
                pvVar33 = (void *)((long)pvVar33 + lVar28 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              }
              pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar32 * 4);
            }
          }
        }
        else {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          if (a[1].dims == 1) {
            if (a[1].w == 1) {
              fVar35 = *a[1].data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar16 = 0;
              }
              pvVar22 = a->data;
              if ((int)uVar2 < 1) {
                uVar14 = 0;
              }
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) * fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
                pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
              }
            }
            else {
              pvVar22 = a->data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar16 = 0;
              }
              sVar7 = a->elemsize;
              if ((int)uVar2 < 1) {
                uVar14 = 0;
              }
              pvVar19 = a[1].data;
              sVar8 = a->cstep;
              for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) * fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
                pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
              }
            }
          }
          else {
            if (a[1].dims != 2) {
              return 0;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            pvVar19 = a[1].data;
            iVar12 = a[1].w;
            sVar7 = a[1].elemsize;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            uVar25 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar7 * uVar16);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  *(float *)((long)pvVar31 + uVar29 * 4) =
                       *(float *)((long)pvVar27 + uVar29 * 4) * fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar9);
            }
          }
        }
        break;
      case 4:
        iVar12 = a[1].dims;
        Mat::create(this_00,uVar21,uVar20,uVar13,uVar2,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (iVar12 == 4) {
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          sVar7 = a[1].elemsize;
          sVar8 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar9 = a[1].cstep;
          pvVar19 = a[1].data;
          sVar10 = a->cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar18 + uVar25 * 4) =
                   *(float *)((long)pvVar19 + uVar25 * 4) * *(float *)((long)pvVar22 + uVar25 * 4);
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
          }
        }
        else {
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          iVar12 = a[1].dims;
          if (iVar12 == 1) {
            if (a[1].w == 1) {
              fVar35 = *a[1].data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar16 = 0;
              }
              pvVar22 = a->data;
              if ((int)uVar2 < 1) {
                uVar14 = 0;
              }
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) * fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
                pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
              }
            }
            else {
              pvVar22 = a->data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar16 = 0;
              }
              sVar7 = a->elemsize;
              if ((int)uVar2 < 1) {
                uVar14 = 0;
              }
              pvVar19 = a[1].data;
              sVar8 = a->cstep;
              for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
                for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                  *(float *)((long)pvVar18 + uVar25 * 4) =
                       *(float *)((long)pvVar22 + uVar25 * 4) * fVar35;
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
                pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
              }
            }
          }
          else if (iVar12 == 3) {
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar22 = a->data;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            pvVar19 = a[1].data;
            sVar10 = this_00->elemsize;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            uVar25 = 0;
            if (0 < (int)uVar20) {
              uVar25 = (ulong)uVar20;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar31 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
              pvVar27 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
              pvVar33 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
              for (uVar21 = 0; uVar21 != uVar13; uVar21 = uVar21 + 1) {
                for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                  fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                  for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                    *(float *)((long)pvVar33 + uVar29 * 4) =
                         *(float *)((long)pvVar31 + uVar29 * 4) * fVar35;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                  pvVar33 = (void *)((long)pvVar33 + lVar23 * 4);
                }
                pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar20 * 4);
              }
            }
          }
          else {
            if (iVar12 != 2) {
              return 0;
            }
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            iVar12 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar22 = a->data;
            sVar9 = this_00->elemsize;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            pvVar19 = a[1].data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            uVar25 = (ulong)uVar13;
            if ((int)uVar13 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
              pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar8 * uVar16);
                for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                  for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                    *(float *)((long)pvVar31 + uVar29 * 4) =
                         *(float *)((long)pvVar27 + uVar29 * 4) * fVar35;
                  }
                  pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                  pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                }
              }
            }
          }
        }
      }
    }
    break;
  case 3:
    pMVar24 = pMVar1;
    goto LAB_003648cf;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar21 = a->w;
    lVar23 = (long)(int)uVar21;
    uVar20 = a->h;
    uVar13 = a->d;
    uVar2 = a->c;
    uVar14 = (ulong)uVar2;
    uVar26 = uVar20 * uVar21 * uVar13;
    uVar16 = (ulong)uVar26;
    sVar5 = a->elemsize;
    uVar3 = a[1].w;
    lVar28 = (long)(int)uVar3;
    uVar32 = a[1].h;
    uVar17 = a[1].d;
    uVar4 = a[1].c;
    uVar34 = (ulong)uVar4;
    uVar15 = uVar32 * uVar3 * uVar17;
    uVar25 = (ulong)uVar15;
    switch(a->dims) {
    case 1:
      iVar12 = a[1].dims + -1;
      if (uVar21 == 1) {
        switch(iVar12) {
        case 0:
          Mat::create(this_00,uVar3,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              fVar36 = *(float *)((long)pvVar22 + uVar34 * 4);
              if (fVar36 <= fVar35) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar18 + uVar34 * 4) = fVar36;
            }
            return 0;
          }
          return -100;
        case 1:
          Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
              fVar36 = *(float *)((long)pvVar22 + uVar14 * 4);
              if (fVar36 <= fVar35) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar18 + uVar14 * 4) = fVar36;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        switch(iVar12) {
        case 0:
          Mat::create(this_00,uVar21,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (a[1].w == 1) {
              pvVar22 = a->data;
              fVar35 = *a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar34 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar36;
              }
              return 0;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
              fVar36 = *(float *)((long)pvVar22 + uVar34 * 4);
              if (fVar35 <= fVar36) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar34 * 4) = fVar35;
            }
            return 0;
          }
          return -100;
        case 1:
          Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar34 * 4);
              for (uVar25 = 0; uVar14 != uVar25; uVar25 = uVar25 + 1) {
                fVar36 = *(float *)((long)pvVar19 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar19 + uVar16 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar19 + uVar16 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        }
      }
      break;
    case 2:
      pAVar11 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,pAVar11);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 != 0) {
          pvVar22 = a->data;
          pvVar19 = a[1].data;
          iVar12 = a->w;
          sVar6 = a->elemsize;
          sVar7 = a[1].elemsize;
          uVar14 = 0;
          if (0 < (int)uVar3) {
            uVar14 = (ulong)uVar3;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar34 = 0;
          }
          sVar8 = this_00->elemsize;
          sVar9 = a[1].cstep;
          for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
            pvVar27 = pvVar19;
            pvVar31 = pvVar18;
            for (uVar16 = 0; uVar16 != uVar32; uVar16 = uVar16 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar16 * 4 + (long)iVar12 * sVar6 * uVar25);
              for (uVar30 = 0; uVar14 != uVar30; uVar30 = uVar30 + 1) {
                fVar36 = *(float *)((long)pvVar27 + uVar30 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar31 + uVar30 * 4) = fVar36;
              }
              pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,pAVar11);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 != 0) {
          iVar12 = a->w;
          sVar6 = a->elemsize;
          sVar7 = a[1].elemsize;
          sVar8 = a[1].cstep;
          pvVar22 = a->data;
          sVar9 = this_00->elemsize;
          uVar14 = 0;
          if (0 < (int)uVar3) {
            uVar14 = (ulong)uVar3;
          }
          pvVar19 = a[1].data;
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          uVar25 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar34 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
            pvVar27 = (void *)(sVar7 * sVar8 * uVar16 + (long)pvVar19);
            pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
            for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar6 * uVar16);
              for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                  if (fVar36 <= fVar35) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              }
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar21,uVar20,sVar5,pAVar11);
      pvVar18 = this_00->data;
      if (pvVar18 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          pvVar22 = a->data;
          pvVar19 = a[1].data;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
            fVar35 = *(float *)((long)pvVar19 + uVar14 * 4);
            fVar36 = *(float *)((long)pvVar22 + uVar14 * 4);
            if (fVar35 <= fVar36) {
              fVar35 = fVar36;
            }
            *(float *)((long)pvVar18 + uVar14 * 4) = fVar35;
          }
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar21,uVar20,sVar5,opt->blob_allocator);
      pvVar18 = this_00->data;
      if (pvVar18 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (a[1].w == 1) {
          pvVar22 = a->data;
          fVar35 = *a[1].data;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
            fVar36 = *(float *)((long)pvVar22 + uVar14 * 4);
            if (fVar36 <= fVar35) {
              fVar36 = fVar35;
            }
            *(float *)((long)pvVar18 + uVar14 * 4) = fVar36;
          }
          return 0;
        }
        pvVar22 = a->data;
        pvVar19 = a[1].data;
        uVar14 = 0;
        if (0 < (int)uVar21) {
          uVar14 = (ulong)uVar21;
        }
        uVar34 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar34 = 0;
        }
        for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
          fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
            if (fVar36 <= fVar35) {
              fVar36 = fVar35;
            }
            *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
          }
          pvVar18 = (void *)((long)pvVar18 + lVar23 * 4);
          pvVar22 = (void *)((long)pvVar22 + lVar23 * 4);
        }
        return 0;
      }
      return -100;
    case 3:
      if (a[1].dims == 3) {
        uVar13 = uVar4 ^ uVar2;
        if ((uVar32 == 1 && uVar3 == 1) && uVar13 == 0) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = a[1].elemsize;
          sVar7 = a[1].cstep;
          sVar8 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          sVar9 = a->elemsize;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          pvVar19 = a[1].data;
          sVar10 = a->cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar19 + sVar6 * sVar7 * uVar34);
              fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
              if (fVar35 <= fVar36) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar10);
          }
        }
        else if ((uVar3 == uVar21) && (uVar4 == 1 && uVar32 == uVar20)) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          sVar7 = a->elemsize;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          pvVar19 = a[1].data;
          sVar8 = a->cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
              fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
              if (fVar35 <= fVar36) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
            pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
          }
        }
        else if ((uVar20 == 1 && uVar21 == 1) && uVar13 == 0) {
          Mat::create(this_00,uVar3,uVar32,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          sVar8 = this_00->elemsize;
          if ((int)uVar15 < 1) {
            uVar25 = 0;
          }
          pvVar19 = a[1].data;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar16 * 4);
              fVar36 = *(float *)((long)pvVar22 + sVar6 * sVar7 * uVar34);
              if (fVar35 <= fVar36) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar16 * 4) = fVar35;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
          }
        }
        else if ((uVar3 == uVar21) && (uVar2 == 1 && uVar32 == uVar20)) {
          Mat::create(this_00,uVar21,uVar20,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = this_00->elemsize;
          if ((int)uVar15 < 1) {
            uVar25 = 0;
          }
          pvVar19 = a[1].data;
          if ((int)uVar4 < 1) {
            uVar34 = 0;
          }
          sVar7 = a[1].elemsize;
          sVar8 = a[1].cstep;
          for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
            for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar16 * 4);
              fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
              if (fVar35 <= fVar36) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar16 * 4) = fVar35;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
            pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
          }
        }
        else {
          if (((uVar32 != uVar20 || uVar3 != 1) || uVar13 != 0) || uVar21 == 1) {
            if (((uVar32 == 1 && uVar21 == uVar3) && uVar13 == 0) && uVar20 != 1) {
              Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
              pvVar18 = this_00->data;
              if (pvVar18 == (void *)0x0) {
                return -100;
              }
              sVar5 = this_00->cstep;
              if ((long)this_00->c * sVar5 != 0) {
                pvVar22 = a->data;
                sVar6 = a->elemsize;
                uVar34 = 0;
                if (0 < (int)uVar21) {
                  uVar34 = (ulong)uVar21;
                }
                pvVar19 = a[1].data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                sVar7 = a[1].elemsize;
                if ((int)uVar2 < 1) {
                  uVar14 = 0;
                }
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                sVar10 = a->cstep;
                for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
                  pvVar27 = pvVar22;
                  pvVar31 = pvVar18;
                  for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                    for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                      fVar35 = *(float *)((long)pvVar19 + uVar16 * 4);
                      fVar36 = *(float *)((long)pvVar27 + uVar16 * 4);
                      if (fVar35 <= fVar36) {
                        fVar35 = fVar36;
                      }
                      *(float *)((long)pvVar31 + uVar16 * 4) = fVar35;
                    }
                    pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                    pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                  }
                  pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                  pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
                }
                return 0;
              }
              return -100;
            }
            if (((uVar21 == 1 && uVar20 == uVar32) && uVar13 == 0) && uVar3 != 1) {
              Mat::create(this_00,uVar3,uVar20,uVar2,sVar5,opt->blob_allocator);
              pvVar18 = this_00->data;
              if (pvVar18 == (void *)0x0) {
                return -100;
              }
              sVar5 = this_00->cstep;
              if ((long)this_00->c * sVar5 != 0) {
                sVar6 = a->elemsize;
                sVar7 = a->cstep;
                pvVar22 = a->data;
                pvVar19 = a[1].data;
                sVar8 = a[1].elemsize;
                uVar34 = 0;
                if (0 < (int)uVar3) {
                  uVar34 = (ulong)uVar3;
                }
                uVar25 = (ulong)uVar20;
                if ((int)uVar20 < 1) {
                  uVar25 = 0;
                }
                if ((int)uVar2 < 1) {
                  uVar14 = 0;
                }
                sVar9 = this_00->elemsize;
                sVar10 = a[1].cstep;
                for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
                  pvVar27 = pvVar19;
                  pvVar31 = pvVar18;
                  for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                    fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + sVar6 * sVar7 * uVar16);
                    for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                      fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                      if (fVar36 <= fVar35) {
                        fVar36 = fVar35;
                      }
                      *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                    }
                    pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                    pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                  }
                  pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
                  pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                }
                return 0;
              }
              return -100;
            }
            if (((uVar21 != uVar3 || uVar20 != 1) || uVar13 != 0) || uVar32 == 1) {
              Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
              pvVar18 = this_00->data;
              if (pvVar18 == (void *)0x0) {
                return -100;
              }
              sVar5 = this_00->cstep;
              if ((long)this_00->c * sVar5 != 0) {
                pvVar22 = a->data;
                sVar6 = a->elemsize;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                if ((int)uVar26 < 1) {
                  uVar16 = 0;
                }
                if ((int)uVar2 < 1) {
                  uVar14 = 0;
                }
                sVar9 = a[1].cstep;
                pvVar19 = a[1].data;
                sVar10 = a->cstep;
                for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
                  for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                    fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
                    fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                    if (fVar35 <= fVar36) {
                      fVar35 = fVar36;
                    }
                    *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
                  }
                  pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                  pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
                }
                return 0;
              }
              return -100;
            }
            Mat::create(this_00,uVar21,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 != 0) {
              pvVar22 = a->data;
              sVar6 = a->elemsize;
              uVar34 = 0;
              if (0 < (int)uVar21) {
                uVar34 = (ulong)uVar21;
              }
              pvVar19 = a[1].data;
              if ((int)uVar32 < 1) {
                uVar32 = 0;
              }
              sVar7 = a[1].elemsize;
              if ((int)uVar2 < 1) {
                uVar14 = 0;
              }
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              sVar10 = a->cstep;
              for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
                pvVar27 = pvVar19;
                pvVar31 = pvVar18;
                for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                  for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                    fVar35 = *(float *)((long)pvVar27 + uVar16 * 4);
                    fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                    if (fVar35 <= fVar36) {
                      fVar35 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar16 * 4) = fVar35;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
                pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          pvVar19 = a[1].data;
          sVar7 = a[1].elemsize;
          sVar8 = a[1].cstep;
          uVar34 = 0;
          if (0 < (int)uVar21) {
            uVar34 = (ulong)uVar21;
          }
          uVar25 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar9 = this_00->elemsize;
          sVar10 = a->cstep;
          for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
            pvVar27 = pvVar22;
            pvVar31 = pvVar18;
            for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + sVar7 * sVar8 * uVar16);
              for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
              }
              pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
          }
        }
      }
      else if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 == 0) {
          return -100;
        }
        sVar6 = a->elemsize;
        sVar7 = a->cstep;
        pvVar22 = a->data;
        sVar8 = a[1].elemsize;
        sVar9 = a[1].cstep;
        pvVar19 = a[1].data;
        sVar10 = this_00->elemsize;
        uVar14 = 0;
        if (0 < (int)uVar3) {
          uVar14 = (ulong)uVar3;
        }
        uVar25 = 0;
        if (0 < (int)uVar32) {
          uVar25 = (ulong)uVar32;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        if ((int)uVar4 < 1) {
          uVar34 = 0;
        }
        for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
          pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
          pvVar33 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
          pvVar31 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
          for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
            for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
              fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
              for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                fVar36 = *(float *)((long)pvVar33 + uVar29 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
              }
              pvVar33 = (void *)((long)pvVar33 + lVar28 * 4);
              pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
            }
            pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar32 * 4);
          }
        }
      }
      else {
        Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (a[1].w == 1) {
            fVar35 = *a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            pvVar22 = a->data;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
          else {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            sVar7 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            pvVar19 = a[1].data;
            sVar8 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
        }
        else {
          if (a[1].dims != 2) {
            return 0;
          }
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          pvVar19 = a[1].data;
          iVar12 = a[1].w;
          sVar7 = a[1].elemsize;
          uVar34 = 0;
          if (0 < (int)uVar21) {
            uVar34 = (ulong)uVar21;
          }
          uVar25 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
            pvVar27 = pvVar22;
            pvVar31 = pvVar18;
            for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar7 * uVar16);
              for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
              }
              pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar9);
          }
        }
      }
      break;
    case 4:
      iVar12 = a[1].dims;
      Mat::create(this_00,uVar21,uVar20,uVar13,uVar2,sVar5,opt->blob_allocator);
      pvVar18 = this_00->data;
      if (iVar12 == 4) {
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 == 0) {
          return -100;
        }
        pvVar22 = a->data;
        sVar6 = a->elemsize;
        sVar7 = a[1].elemsize;
        sVar8 = this_00->elemsize;
        if ((int)uVar26 < 1) {
          uVar16 = 0;
        }
        if ((int)uVar2 < 1) {
          uVar14 = 0;
        }
        sVar9 = a[1].cstep;
        pvVar19 = a[1].data;
        sVar10 = a->cstep;
        for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
          for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
            fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
            fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
            if (fVar35 <= fVar36) {
              fVar35 = fVar36;
            }
            *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
          }
          pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
          pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
          pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
        }
      }
      else {
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 == 0) {
          return -100;
        }
        iVar12 = a[1].dims;
        if (iVar12 == 1) {
          if (a[1].w == 1) {
            fVar35 = *a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            pvVar22 = a->data;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
          else {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            sVar7 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            pvVar19 = a[1].data;
            sVar8 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
        }
        else if (iVar12 == 3) {
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          pvVar22 = a->data;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar19 = a[1].data;
          sVar10 = this_00->elemsize;
          uVar34 = 0;
          if (0 < (int)uVar21) {
            uVar34 = (ulong)uVar21;
          }
          uVar25 = 0;
          if (0 < (int)uVar20) {
            uVar25 = (ulong)uVar20;
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
            pvVar31 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
            pvVar27 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
            pvVar33 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
            for (uVar21 = 0; uVar21 != uVar13; uVar21 = uVar21 + 1) {
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar31 + uVar29 * 4);
                  if (fVar36 <= fVar35) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar33 + uVar29 * 4) = fVar36;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar33 = (void *)((long)pvVar33 + lVar23 * 4);
              }
              pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar20 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            return 0;
          }
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          iVar12 = a[1].w;
          sVar8 = a[1].elemsize;
          pvVar22 = a->data;
          sVar9 = this_00->elemsize;
          uVar34 = 0;
          if (0 < (int)uVar21) {
            uVar34 = (ulong)uVar21;
          }
          pvVar19 = a[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          uVar25 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
            pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
            pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
            for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar8 * uVar16);
              for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                  if (fVar36 <= fVar35) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              }
            }
          }
        }
      }
    }
    break;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar21 = a->w;
    lVar23 = (long)(int)uVar21;
    uVar20 = a->h;
    uVar13 = a->d;
    uVar2 = a->c;
    uVar14 = (ulong)uVar2;
    uVar26 = uVar20 * uVar21 * uVar13;
    uVar16 = (ulong)uVar26;
    sVar5 = a->elemsize;
    uVar3 = a[1].w;
    lVar28 = (long)(int)uVar3;
    uVar32 = a[1].h;
    uVar17 = a[1].d;
    uVar4 = a[1].c;
    uVar34 = (ulong)uVar4;
    uVar15 = uVar32 * uVar3 * uVar17;
    uVar25 = (ulong)uVar15;
    switch(a->dims) {
    case 1:
      iVar12 = a[1].dims + -1;
      if (uVar21 == 1) {
        switch(iVar12) {
        case 0:
          Mat::create(this_00,uVar3,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              fVar36 = *(float *)((long)pvVar22 + uVar34 * 4);
              if (fVar35 <= fVar36) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar18 + uVar34 * 4) = fVar36;
            }
            return 0;
          }
          return -100;
        case 1:
          Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
              fVar36 = *(float *)((long)pvVar22 + uVar14 * 4);
              if (fVar35 <= fVar36) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar18 + uVar14 * 4) = fVar36;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        switch(iVar12) {
        case 0:
          Mat::create(this_00,uVar21,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (a[1].w == 1) {
              pvVar22 = a->data;
              fVar35 = *a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar34 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar36;
              }
              return 0;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
              fVar36 = *(float *)((long)pvVar22 + uVar34 * 4);
              if (fVar36 <= fVar35) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar34 * 4) = fVar35;
            }
            return 0;
          }
          return -100;
        case 1:
          Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar34 * 4);
              for (uVar25 = 0; uVar14 != uVar25; uVar25 = uVar25 + 1) {
                fVar36 = *(float *)((long)pvVar19 + uVar25 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar19 + uVar16 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar19 + uVar16 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        }
      }
      break;
    case 2:
      pAVar11 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,pAVar11);
        pvVar18 = this_00->data;
        if (pvVar18 != (void *)0x0) {
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            iVar12 = a->w;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar16 = 0; uVar16 != uVar32; uVar16 = uVar16 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar16 * 4 + (long)iVar12 * sVar6 * uVar25);
                for (uVar30 = 0; uVar14 != uVar30; uVar30 = uVar30 + 1) {
                  fVar36 = *(float *)((long)pvVar27 + uVar30 * 4);
                  if (fVar35 <= fVar36) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar30 * 4) = fVar36;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            }
            return 0;
          }
          return -100;
        }
      }
      else if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,pAVar11);
        pvVar18 = this_00->data;
        if (pvVar18 != (void *)0x0) {
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            iVar12 = a->w;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            pvVar22 = a->data;
            sVar9 = this_00->elemsize;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            pvVar19 = a[1].data;
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            uVar25 = (ulong)uVar17;
            if ((int)uVar17 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
              pvVar27 = (void *)(sVar7 * sVar8 * uVar16 + (long)pvVar19);
              pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar6 * uVar16);
                for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                  for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                    fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                    if (fVar35 <= fVar36) {
                      fVar36 = fVar35;
                    }
                    *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                  }
                  pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        Mat::create(this_00,uVar21,uVar20,sVar5,pAVar11);
        pvVar18 = this_00->data;
        if ((pvVar18 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (a[1].dims != 1) {
            if (a[1].dims == 2) {
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              if ((int)uVar26 < 1) {
                uVar16 = 0;
              }
              for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar14 * 4);
                fVar36 = *(float *)((long)pvVar22 + uVar14 * 4);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar18 + uVar14 * 4) = fVar35;
              }
              return 0;
            }
            return 0;
          }
          Mat::create(this_00,uVar21,uVar20,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (a[1].w == 1) {
              pvVar22 = a->data;
              fVar35 = *a[1].data;
              if ((int)uVar26 < 1) {
                uVar16 = 0;
              }
              for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar14 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar14 * 4) = fVar36;
              }
              return 0;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            uVar34 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar34 = 0;
            }
            for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
              for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar35 <= fVar36) {
                  fVar36 = fVar35;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar23 * 4);
              pvVar22 = (void *)((long)pvVar22 + lVar23 * 4);
            }
            return 0;
          }
          return -100;
        }
      }
      return -100;
    case 3:
      if (a[1].dims == 3) {
        uVar13 = uVar4 ^ uVar2;
        if ((uVar32 == 1 && uVar3 == 1) && uVar13 == 0) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = a[1].elemsize;
            sVar7 = a[1].cstep;
            sVar8 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            sVar9 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar35 = *(float *)((long)pvVar19 + sVar6 * sVar7 * uVar34);
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar10);
            }
            return 0;
          }
          return -100;
        }
        if ((uVar3 == uVar21) && (uVar4 == 1 && uVar32 == uVar20)) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            sVar7 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            pvVar19 = a[1].data;
            sVar8 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        }
        if ((uVar20 == 1 && uVar21 == 1) && uVar13 == 0) {
          Mat::create(this_00,uVar3,uVar32,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            sVar8 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar16 * 4);
                fVar36 = *(float *)((long)pvVar22 + sVar6 * sVar7 * uVar34);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
            }
            return 0;
          }
          return -100;
        }
        if ((uVar3 == uVar21) && (uVar2 == 1 && uVar32 == uVar20)) {
          Mat::create(this_00,uVar21,uVar20,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar34 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar34; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar25 != uVar16; uVar16 = uVar16 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar16 * 4);
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            return 0;
          }
          return -100;
        }
        if (((uVar32 == uVar20 && uVar3 == 1) && uVar13 == 0) && uVar21 != 1) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            uVar25 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + sVar7 * sVar8 * uVar16);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                  if (fVar35 <= fVar36) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
            return 0;
          }
          return -100;
        }
        if (((uVar32 == 1 && uVar21 == uVar3) && uVar13 == 0) && uVar20 != 1) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            uVar34 = 0;
            if (0 < (int)uVar21) {
              uVar34 = (ulong)uVar21;
            }
            pvVar19 = a[1].data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            sVar7 = a[1].elemsize;
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              pvVar27 = pvVar22;
              pvVar31 = pvVar18;
              for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                  fVar35 = *(float *)((long)pvVar19 + uVar16 * 4);
                  fVar36 = *(float *)((long)pvVar27 + uVar16 * 4);
                  if (fVar36 <= fVar35) {
                    fVar35 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar16 * 4) = fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
            return 0;
          }
          return -100;
        }
        if (((uVar21 == 1 && uVar20 == uVar32) && uVar13 == 0) && uVar3 != 1) {
          Mat::create(this_00,uVar3,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            uVar34 = 0;
            if (0 < (int)uVar3) {
              uVar34 = (ulong)uVar3;
            }
            uVar25 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + sVar6 * sVar7 * uVar16);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                  if (fVar35 <= fVar36) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
            }
            return 0;
          }
          return -100;
        }
        if (((uVar21 != uVar3 || uVar20 != 1) || uVar13 != 0) || uVar32 == 1) {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 != 0) {
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar16 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar14 = 0;
            }
            sVar9 = a[1].cstep;
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
                fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar21,uVar32,uVar2,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 != 0) {
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          uVar34 = 0;
          if (0 < (int)uVar21) {
            uVar34 = (ulong)uVar21;
          }
          pvVar19 = a[1].data;
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          sVar7 = a[1].elemsize;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar8 = this_00->elemsize;
          sVar9 = a[1].cstep;
          sVar10 = a->cstep;
          for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
            pvVar27 = pvVar19;
            pvVar31 = pvVar18;
            for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar35 = *(float *)((long)pvVar27 + uVar16 * 4);
                fVar36 = *(float *)((long)pvVar22 + uVar16 * 4);
                if (fVar36 <= fVar35) {
                  fVar35 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar16 * 4) = fVar35;
              }
              pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
        pvVar18 = this_00->data;
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 != 0) {
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          pvVar22 = a->data;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar19 = a[1].data;
          sVar10 = this_00->elemsize;
          uVar14 = 0;
          if (0 < (int)uVar3) {
            uVar14 = (ulong)uVar3;
          }
          uVar25 = 0;
          if (0 < (int)uVar32) {
            uVar25 = (ulong)uVar32;
          }
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar34 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar34; uVar16 = uVar16 + 1) {
            pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
            pvVar33 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
            pvVar31 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
            for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar33 + uVar29 * 4);
                  if (fVar35 <= fVar36) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                }
                pvVar33 = (void *)((long)pvVar33 + lVar28 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              }
              pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar32 * 4);
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
      pvVar18 = this_00->data;
      if (pvVar18 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_00->cstep;
      if ((long)this_00->c * sVar5 == 0) {
        return -100;
      }
      if (a[1].dims == 1) {
        if (a[1].w == 1) {
          fVar35 = *a[1].data;
          sVar6 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          pvVar22 = a->data;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
              if (fVar35 <= fVar36) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
            pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
          }
          return 0;
        }
        pvVar22 = a->data;
        sVar6 = this_00->elemsize;
        if ((int)uVar26 < 1) {
          uVar16 = 0;
        }
        sVar7 = a->elemsize;
        if ((int)uVar2 < 1) {
          uVar14 = 0;
        }
        pvVar19 = a[1].data;
        sVar8 = a->cstep;
        for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
          fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
          for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
            fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
            if (fVar35 <= fVar36) {
              fVar36 = fVar35;
            }
            *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
          }
          pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
          pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
        }
        return 0;
      }
      if (a[1].dims == 2) {
        pvVar22 = a->data;
        sVar6 = a->elemsize;
        pvVar19 = a[1].data;
        iVar12 = a[1].w;
        sVar7 = a[1].elemsize;
        uVar34 = 0;
        if (0 < (int)uVar21) {
          uVar34 = (ulong)uVar21;
        }
        uVar25 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar25 = 0;
        }
        if ((int)uVar2 < 1) {
          uVar14 = 0;
        }
        sVar8 = this_00->elemsize;
        sVar9 = a->cstep;
        for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
          pvVar27 = pvVar22;
          pvVar31 = pvVar18;
          for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
            fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar7 * uVar16);
            for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
              fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
              if (fVar35 <= fVar36) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
            }
            pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
            pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
          }
          pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
          pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar9);
        }
        return 0;
      }
      return 0;
    case 4:
      iVar12 = a[1].dims;
      Mat::create(this_00,uVar21,uVar20,uVar13,uVar2,sVar5,opt->blob_allocator);
      pvVar18 = this_00->data;
      if (iVar12 == 4) {
        if (pvVar18 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_00->cstep;
        if ((long)this_00->c * sVar5 != 0) {
          pvVar22 = a->data;
          sVar6 = a->elemsize;
          sVar7 = a[1].elemsize;
          sVar8 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar9 = a[1].cstep;
          pvVar19 = a[1].data;
          sVar10 = a->cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
              fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
              if (fVar36 <= fVar35) {
                fVar35 = fVar36;
              }
              *(float *)((long)pvVar18 + uVar25 * 4) = fVar35;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
          }
          return 0;
        }
        return -100;
      }
      if (pvVar18 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_00->cstep;
      if ((long)this_00->c * sVar5 == 0) {
        return -100;
      }
      iVar12 = a[1].dims;
      if (iVar12 == 1) {
        if (a[1].w == 1) {
          fVar35 = *a[1].data;
          sVar6 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar16 = 0;
          }
          pvVar22 = a->data;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
              if (fVar35 <= fVar36) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
            }
            pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
            pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
          }
          return 0;
        }
        pvVar22 = a->data;
        sVar6 = this_00->elemsize;
        if ((int)uVar26 < 1) {
          uVar16 = 0;
        }
        sVar7 = a->elemsize;
        if ((int)uVar2 < 1) {
          uVar14 = 0;
        }
        pvVar19 = a[1].data;
        sVar8 = a->cstep;
        for (uVar34 = 0; uVar34 != uVar14; uVar34 = uVar34 + 1) {
          fVar35 = *(float *)((long)pvVar19 + uVar34 * 4);
          for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
            fVar36 = *(float *)((long)pvVar22 + uVar25 * 4);
            if (fVar35 <= fVar36) {
              fVar36 = fVar35;
            }
            *(float *)((long)pvVar18 + uVar25 * 4) = fVar36;
          }
          pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
          pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
        }
        return 0;
      }
      if (iVar12 != 3) {
        if (iVar12 == 2) {
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          iVar12 = a[1].w;
          sVar8 = a[1].elemsize;
          pvVar22 = a->data;
          sVar9 = this_00->elemsize;
          uVar34 = 0;
          if (0 < (int)uVar21) {
            uVar34 = (ulong)uVar21;
          }
          pvVar19 = a[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          uVar25 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
            pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
            pvVar31 = (void *)(sVar5 * sVar9 * uVar16 + (long)pvVar18);
            for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
              fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + (long)iVar12 * sVar8 * uVar16);
              for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = *(float *)((long)pvVar27 + uVar29 * 4);
                  if (fVar35 <= fVar36) {
                    fVar36 = fVar35;
                  }
                  *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              }
            }
          }
          return 0;
        }
        return 0;
      }
      sVar6 = a->elemsize;
      sVar7 = a->cstep;
      pvVar22 = a->data;
      sVar8 = a[1].elemsize;
      sVar9 = a[1].cstep;
      pvVar19 = a[1].data;
      sVar10 = this_00->elemsize;
      uVar34 = 0;
      if (0 < (int)uVar21) {
        uVar34 = (ulong)uVar21;
      }
      uVar25 = 0;
      if (0 < (int)uVar20) {
        uVar25 = (ulong)uVar20;
      }
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      if ((int)uVar2 < 1) {
        uVar14 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        pvVar31 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
        pvVar27 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
        pvVar33 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
        for (uVar21 = 0; uVar21 != uVar13; uVar21 = uVar21 + 1) {
          for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
            fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
            for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
              fVar36 = *(float *)((long)pvVar31 + uVar29 * 4);
              if (fVar35 <= fVar36) {
                fVar36 = fVar35;
              }
              *(float *)((long)pvVar33 + uVar29 * 4) = fVar36;
            }
            pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
            pvVar33 = (void *)((long)pvVar33 + lVar23 * 4);
          }
          pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar20 * 4);
        }
      }
      return 0;
    }
    break;
  case 6:
    if (a->dims - 1U < 4) {
      uVar21 = a->w;
      lVar28 = (long)(int)uVar21;
      uVar20 = a->h;
      uVar13 = a->d;
      uVar30 = (ulong)uVar13;
      uVar2 = a->c;
      uVar25 = (ulong)uVar2;
      uVar26 = uVar20 * uVar21 * uVar13;
      uVar29 = (ulong)uVar26;
      sVar5 = a->elemsize;
      uVar3 = a[1].w;
      lVar23 = (long)(int)uVar3;
      uVar32 = a[1].h;
      uVar17 = a[1].d;
      uVar16 = (ulong)uVar17;
      uVar4 = a[1].c;
      uVar14 = (ulong)uVar4;
      uVar15 = uVar32 * uVar3 * uVar17;
      uVar34 = (ulong)uVar15;
      switch(a->dims) {
      case 1:
        iVar12 = a[1].dims + -1;
        if (uVar21 == 1) {
          switch(iVar12) {
          case 0:
            Mat::create(this_00,uVar3,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
              fVar36 = powf(fVar35,*(float *)((long)pvVar22 + uVar34 * 4));
              *(float *)((long)pvVar18 + uVar34 * 4) = fVar36;
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            fVar35 = *a->data;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            for (uVar14 = 0; uVar34 != uVar14; uVar14 = uVar14 + 1) {
              fVar36 = powf(fVar35,*(float *)((long)pvVar22 + uVar14 * 4));
              *(float *)((long)pvVar18 + uVar14 * 4) = fVar36;
            }
            break;
          case 2:
            Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar14 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = powf(fVar35,*(float *)((long)pvVar22 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            break;
          case 3:
            Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a[1].data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            fVar35 = *a->data;
            if ((int)uVar4 < 1) {
              uVar14 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = powf(fVar35,*(float *)((long)pvVar22 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
            break;
          default:
            return 0;
          }
        }
        else {
          switch(iVar12) {
          case 0:
            Mat::create(this_00,uVar21,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (a[1].w == 1) {
              pvVar22 = a->data;
              fVar35 = *a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                fVar36 = powf(*(float *)((long)pvVar22 + uVar34 * 4),fVar35);
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar36;
              }
            }
            else {
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              for (uVar34 = 0; uVar14 != uVar34; uVar34 = uVar34 + 1) {
                fVar35 = powf(*(float *)((long)pvVar22 + uVar34 * 4),
                              *(float *)((long)pvVar19 + uVar34 * 4));
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar35;
              }
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,uVar32,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            uVar34 = (ulong)uVar32;
            if ((int)uVar32 < 1) {
              uVar34 = 0;
            }
            for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar25 * 4);
              for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = powf(fVar35,*(float *)((long)pvVar19 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar23 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar23 * 4);
            }
            break;
          case 2:
            Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar14 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar25 * 4);
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = powf(fVar35,*(float *)((long)pvVar19 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            break;
          case 3:
            Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar14 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              fVar35 = *(float *)((long)pvVar22 + uVar25 * 4);
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar36 = powf(fVar35,*(float *)((long)pvVar19 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
            break;
          default:
            return 0;
          }
        }
        break;
      case 2:
        pAVar11 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar3,uVar32,uVar4,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if (pvVar18 != (void *)0x0) {
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 != 0) {
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              iVar12 = a->w;
              sVar6 = a->elemsize;
              sVar7 = a[1].elemsize;
              uVar34 = 0;
              if (0 < (int)uVar3) {
                uVar34 = (ulong)uVar3;
              }
              uVar25 = (ulong)uVar32;
              if ((int)uVar32 < 1) {
                uVar25 = 0;
              }
              if ((int)uVar4 < 1) {
                uVar14 = 0;
              }
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
                pvVar27 = pvVar19;
                pvVar31 = pvVar18;
                for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                  fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar6 * uVar16);
                  for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                    fVar36 = powf(fVar35,*(float *)((long)pvVar27 + uVar29 * 4));
                    *(float *)((long)pvVar31 + uVar29 * 4) = fVar36;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                }
                pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
                pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              }
              return 0;
            }
            return -100;
          }
        }
        else if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if (pvVar18 != (void *)0x0) {
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 != 0) {
              iVar12 = a->w;
              sVar6 = a->elemsize;
              sVar7 = a[1].elemsize;
              sVar8 = a[1].cstep;
              pvVar22 = a->data;
              sVar9 = this_00->elemsize;
              uVar34 = 0;
              if (0 < (int)uVar3) {
                uVar34 = (ulong)uVar3;
              }
              pvVar19 = a[1].data;
              if ((int)uVar32 < 1) {
                uVar32 = 0;
              }
              if ((int)uVar17 < 1) {
                uVar16 = 0;
              }
              if ((int)uVar4 < 1) {
                uVar14 = 0;
              }
              for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
                pvVar31 = (void *)(sVar7 * sVar8 * uVar25 + (long)pvVar19);
                pvVar27 = (void *)(sVar5 * sVar9 * uVar25 + (long)pvVar18);
                for (uVar30 = 0; uVar30 != uVar16; uVar30 = uVar30 + 1) {
                  fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar6 * uVar25);
                  for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                    for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                      fVar36 = powf(fVar35,*(float *)((long)pvVar31 + uVar29 * 4));
                      *(float *)((long)pvVar27 + uVar29 * 4) = fVar36;
                    }
                    pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                    pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                  }
                }
              }
              return 0;
            }
            return -100;
          }
        }
        else {
          Mat::create(this_00,uVar21,uVar20,sVar5,pAVar11);
          pvVar18 = this_00->data;
          if ((pvVar18 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if (a[1].dims != 1) {
              if (a[1].dims == 2) {
                pvVar22 = a->data;
                pvVar19 = a[1].data;
                if ((int)uVar26 < 1) {
                  uVar29 = 0;
                }
                for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                  fVar35 = powf(*(float *)((long)pvVar22 + uVar14 * 4),
                                *(float *)((long)pvVar19 + uVar14 * 4));
                  *(float *)((long)pvVar18 + uVar14 * 4) = fVar35;
                }
                return 0;
              }
              return 0;
            }
            Mat::create(this_00,uVar21,uVar20,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (a[1].w == 1) {
                pvVar22 = a->data;
                fVar35 = *a[1].data;
                if ((int)uVar26 < 1) {
                  uVar29 = 0;
                }
                for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar22 + uVar14 * 4),fVar35);
                  *(float *)((long)pvVar18 + uVar14 * 4) = fVar36;
                }
                return 0;
              }
              pvVar22 = a->data;
              pvVar19 = a[1].data;
              uVar14 = 0;
              if (0 < (int)uVar21) {
                uVar14 = (ulong)uVar21;
              }
              uVar34 = (ulong)uVar20;
              if ((int)uVar20 < 1) {
                uVar34 = 0;
              }
              for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar25 * 4);
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar22 + uVar16 * 4),fVar35);
                  *(float *)((long)pvVar18 + uVar16 * 4) = fVar36;
                }
                pvVar18 = (void *)((long)pvVar18 + lVar28 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar28 * 4);
              }
              return 0;
            }
            return -100;
          }
        }
        return -100;
      case 3:
        if (a[1].dims == 3) {
          uVar13 = uVar4 ^ uVar2;
          if ((uVar32 == 1 && uVar3 == 1) && uVar13 == 0) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a[1].elemsize;
            sVar7 = a[1].cstep;
            sVar8 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar29 = 0;
            }
            sVar9 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
              for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                fVar35 = powf(*(float *)((long)pvVar22 + uVar34 * 4),
                              *(float *)((long)pvVar19 + sVar6 * sVar7 * uVar14));
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar10);
            }
          }
          else if ((uVar3 == uVar21) && (uVar4 == 1 && uVar32 == uVar20)) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar29 = 0;
            }
            sVar7 = a->elemsize;
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            pvVar19 = a[1].data;
            sVar8 = a->cstep;
            for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
              for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                fVar35 = powf(*(float *)((long)pvVar22 + uVar34 * 4),
                              *(float *)((long)pvVar19 + uVar34 * 4));
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar8);
            }
          }
          else if ((uVar20 == 1 && uVar21 == 1) && uVar13 == 0) {
            Mat::create(this_00,uVar3,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            sVar8 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar35 = powf(*(float *)((long)pvVar22 + sVar6 * sVar7 * uVar14),
                              *(float *)((long)pvVar19 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
            }
          }
          else if ((uVar3 == uVar21) && (uVar2 == 1 && uVar32 == uVar20)) {
            Mat::create(this_00,uVar21,uVar20,uVar4,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = this_00->elemsize;
            if ((int)uVar15 < 1) {
              uVar34 = 0;
            }
            pvVar19 = a[1].data;
            if ((int)uVar4 < 1) {
              uVar14 = 0;
            }
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              for (uVar16 = 0; uVar34 != uVar16; uVar16 = uVar16 + 1) {
                fVar35 = powf(*(float *)((long)pvVar22 + uVar16 * 4),
                              *(float *)((long)pvVar19 + uVar16 * 4));
                *(float *)((long)pvVar18 + uVar16 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar8);
            }
          }
          else if (((uVar32 == uVar20 && uVar3 == 1) && uVar13 == 0) && uVar21 != 1) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = a[1].cstep;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            uVar34 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar34 = 0;
            }
            uVar25 = (ulong)uVar2;
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            for (uVar16 = 0; uVar16 != uVar25; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar18;
              pvVar31 = pvVar22;
              for (uVar30 = 0; uVar30 != uVar34; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar19 + uVar30 * 4 + sVar7 * sVar8 * uVar16);
                for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar31 + uVar29 * 4),fVar35);
                  *(float *)((long)pvVar27 + uVar29 * 4) = fVar36;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if (((uVar32 == 1 && uVar21 == uVar3) && uVar13 == 0) && uVar20 != 1) {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            pvVar19 = a[1].data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            sVar7 = a[1].elemsize;
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar25; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar18;
              pvVar31 = pvVar22;
              for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  fVar35 = powf(*(float *)((long)pvVar31 + uVar16 * 4),
                                *(float *)((long)pvVar19 + uVar16 * 4));
                  *(float *)((long)pvVar27 + uVar16 * 4) = fVar35;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else if (((uVar21 == 1 && uVar20 == uVar32) && uVar13 == 0) && uVar3 != 1) {
            Mat::create(this_00,uVar3,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar22 = a->data;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            uVar14 = 0;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            uVar34 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar34 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            for (uVar16 = 0; uVar16 != uVar25; uVar16 = uVar16 + 1) {
              pvVar27 = pvVar18;
              pvVar31 = pvVar19;
              for (uVar30 = 0; uVar30 != uVar34; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + sVar6 * sVar7 * uVar16);
                for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = powf(fVar35,*(float *)((long)pvVar31 + uVar29 * 4));
                  *(float *)((long)pvVar27 + uVar29 * 4) = fVar36;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
            }
          }
          else if (((uVar21 == uVar3 && uVar20 == 1) && uVar13 == 0) && uVar32 != 1) {
            Mat::create(this_00,uVar21,uVar32,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            pvVar19 = a[1].data;
            if ((int)uVar32 < 1) {
              uVar32 = 0;
            }
            sVar7 = a[1].elemsize;
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            sVar10 = a->cstep;
            for (uVar34 = 0; uVar34 != uVar25; uVar34 = uVar34 + 1) {
              pvVar27 = pvVar19;
              pvVar31 = pvVar18;
              for (uVar21 = 0; uVar21 != uVar32; uVar21 = uVar21 + 1) {
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  fVar35 = powf(*(float *)((long)pvVar22 + uVar16 * 4),
                                *(float *)((long)pvVar27 + uVar16 * 4));
                  *(float *)((long)pvVar31 + uVar16 * 4) = fVar35;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
          else {
            Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
            pvVar18 = this_00->data;
            if (pvVar18 == (void *)0x0) {
              return -100;
            }
            sVar5 = this_00->cstep;
            if ((long)this_00->c * sVar5 == 0) {
              return -100;
            }
            pvVar22 = a->data;
            sVar6 = a->elemsize;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            if ((int)uVar26 < 1) {
              uVar29 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar9 = a[1].cstep;
            pvVar19 = a[1].data;
            sVar10 = a->cstep;
            for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
              for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                fVar35 = powf(*(float *)((long)pvVar22 + uVar34 * 4),
                              *(float *)((long)pvVar19 + uVar34 * 4));
                *(float *)((long)pvVar18 + uVar34 * 4) = fVar35;
              }
              pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar10);
            }
          }
        }
        else if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,uVar32,uVar17,uVar4,sVar5,opt->blob_allocator);
          pvVar18 = this_00->data;
          if (pvVar18 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          sVar6 = a->elemsize;
          sVar7 = a->cstep;
          pvVar22 = a->data;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar19 = a[1].data;
          sVar10 = this_00->elemsize;
          uVar34 = 0;
          if (0 < (int)uVar3) {
            uVar34 = (ulong)uVar3;
          }
          uVar25 = 0;
          if (0 < (int)uVar32) {
            uVar25 = (ulong)uVar32;
          }
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar14 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
            pvVar27 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar22);
            pvVar31 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar19);
            pvVar33 = (void *)(sVar5 * sVar10 * uVar16 + (long)pvVar18);
            for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
              for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar27 + uVar30 * 4);
                for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = powf(fVar35,*(float *)((long)pvVar31 + uVar29 * 4));
                  *(float *)((long)pvVar33 + uVar29 * 4) = fVar36;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
                pvVar33 = (void *)((long)pvVar33 + lVar23 * 4);
              }
              pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar32 * 4);
            }
          }
        }
        else {
          Mat::create(this_00,uVar21,uVar20,uVar2,sVar5,opt->blob_allocator);
          local_98 = this_00->data;
          if (local_98 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          if (a[1].dims == 1) {
            if (a[1].w == 1) {
              fVar35 = *a[1].data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar29 = 0;
              }
              pvVar18 = a->data;
              if ((int)uVar2 < 1) {
                uVar25 = 0;
              }
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
                for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar18 + uVar34 * 4),fVar35);
                  *(float *)((long)local_98 + uVar34 * 4) = fVar36;
                }
                local_98 = (void *)((long)local_98 + sVar5 * sVar6);
                pvVar18 = (void *)((long)pvVar18 + sVar7 * sVar8);
              }
            }
            else {
              pvVar18 = a->data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar29 = 0;
              }
              sVar7 = a->elemsize;
              if ((int)uVar2 < 1) {
                uVar25 = 0;
              }
              pvVar22 = a[1].data;
              sVar8 = a->cstep;
              for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
                for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar18 + uVar34 * 4),fVar35);
                  *(float *)((long)local_98 + uVar34 * 4) = fVar36;
                }
                local_98 = (void *)((long)local_98 + sVar5 * sVar6);
                pvVar18 = (void *)((long)pvVar18 + sVar7 * sVar8);
              }
            }
          }
          else {
            if (a[1].dims != 2) {
              return 0;
            }
            pvVar18 = a->data;
            sVar6 = a->elemsize;
            pvVar22 = a[1].data;
            iVar12 = a[1].w;
            sVar7 = a[1].elemsize;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            uVar34 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar34 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            for (uVar16 = 0; uVar16 != uVar25; uVar16 = uVar16 + 1) {
              pvVar19 = local_98;
              pvVar27 = pvVar18;
              for (uVar30 = 0; uVar30 != uVar34; uVar30 = uVar30 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar30 * 4 + (long)iVar12 * sVar7 * uVar16);
                for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar27 + uVar29 * 4),fVar35);
                  *(float *)((long)pvVar19 + uVar29 * 4) = fVar36;
                }
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
              }
              local_98 = (void *)((long)local_98 + sVar5 * sVar8);
              pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar9);
            }
          }
        }
        break;
      case 4:
        iVar12 = a[1].dims;
        Mat::create(this_00,uVar21,uVar20,uVar13,uVar2,sVar5,opt->blob_allocator);
        local_70 = this_00->data;
        if (iVar12 == 4) {
          if (local_70 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          pvVar18 = a->data;
          sVar6 = a->elemsize;
          sVar7 = a[1].elemsize;
          sVar8 = this_00->elemsize;
          if ((int)uVar26 < 1) {
            uVar29 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar25 = 0;
          }
          sVar9 = a[1].cstep;
          pvVar22 = a[1].data;
          sVar10 = a->cstep;
          for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
            for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
              fVar35 = powf(*(float *)((long)pvVar18 + uVar34 * 4),
                            *(float *)((long)pvVar22 + uVar34 * 4));
              *(float *)((long)local_70 + uVar34 * 4) = fVar35;
            }
            local_70 = (void *)((long)local_70 + sVar5 * sVar8);
            pvVar22 = (void *)((long)pvVar22 + sVar7 * sVar9);
            pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar10);
          }
        }
        else {
          if (local_70 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_00->cstep;
          if ((long)this_00->c * sVar5 == 0) {
            return -100;
          }
          iVar12 = a[1].dims;
          if (iVar12 == 1) {
            if (a[1].w == 1) {
              fVar35 = *a[1].data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar29 = 0;
              }
              pvVar18 = a->data;
              if ((int)uVar2 < 1) {
                uVar25 = 0;
              }
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
                for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar18 + uVar34 * 4),fVar35);
                  *(float *)((long)local_70 + uVar34 * 4) = fVar36;
                }
                local_70 = (void *)((long)local_70 + sVar5 * sVar6);
                pvVar18 = (void *)((long)pvVar18 + sVar7 * sVar8);
              }
            }
            else {
              pvVar18 = a->data;
              sVar6 = this_00->elemsize;
              if ((int)uVar26 < 1) {
                uVar29 = 0;
              }
              sVar7 = a->elemsize;
              if ((int)uVar2 < 1) {
                uVar25 = 0;
              }
              pvVar22 = a[1].data;
              sVar8 = a->cstep;
              for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar14 * 4);
                for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
                  fVar36 = powf(*(float *)((long)pvVar18 + uVar34 * 4),fVar35);
                  *(float *)((long)local_70 + uVar34 * 4) = fVar36;
                }
                local_70 = (void *)((long)local_70 + sVar5 * sVar6);
                pvVar18 = (void *)((long)pvVar18 + sVar7 * sVar8);
              }
            }
          }
          else if (iVar12 == 3) {
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            pvVar18 = a->data;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            pvVar22 = a[1].data;
            sVar10 = this_00->elemsize;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            uVar34 = 0;
            if (0 < (int)uVar20) {
              uVar34 = (ulong)uVar20;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar25; uVar16 = uVar16 + 1) {
              pvVar31 = (void *)(sVar6 * sVar7 * uVar16 + (long)pvVar18);
              pvVar19 = (void *)(sVar8 * sVar9 * uVar16 + (long)pvVar22);
              pvVar27 = (void *)(sVar5 * sVar10 * uVar16 + (long)local_70);
              for (uVar21 = 0; uVar21 != uVar13; uVar21 = uVar21 + 1) {
                for (uVar30 = 0; uVar30 != uVar34; uVar30 = uVar30 + 1) {
                  fVar35 = *(float *)((long)pvVar19 + uVar30 * 4);
                  for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                    fVar36 = powf(*(float *)((long)pvVar31 + uVar29 * 4),fVar35);
                    *(float *)((long)pvVar27 + uVar29 * 4) = fVar36;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                }
                pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar20 * 4);
              }
            }
          }
          else {
            if (iVar12 != 2) {
              return 0;
            }
            sVar6 = a->elemsize;
            sVar7 = a->cstep;
            iVar12 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar18 = a->data;
            sVar9 = this_00->elemsize;
            uVar14 = 0;
            if (0 < (int)uVar21) {
              uVar14 = (ulong)uVar21;
            }
            pvVar22 = a[1].data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar13 < 1) {
              uVar30 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar25 = 0;
            }
            for (uVar34 = 0; uVar34 != uVar25; uVar34 = uVar34 + 1) {
              pvVar19 = (void *)(sVar6 * sVar7 * uVar34 + (long)pvVar18);
              pvVar27 = (void *)(sVar5 * sVar9 * uVar34 + (long)local_70);
              for (uVar16 = 0; uVar16 != uVar30; uVar16 = uVar16 + 1) {
                fVar35 = *(float *)((long)pvVar22 + uVar16 * 4 + (long)iVar12 * sVar8 * uVar34);
                for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
                  for (uVar29 = 0; uVar14 != uVar29; uVar29 = uVar29 + 1) {
                    fVar36 = powf(*(float *)((long)pvVar19 + uVar29 * 4),fVar35);
                    *(float *)((long)pvVar27 + uVar29 * 4) = fVar36;
                  }
                  pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar28 * 4);
                }
              }
            }
          }
        }
      }
    }
    return 0;
  case 7:
    pMVar24 = a;
    a = pMVar1;
LAB_00364679:
    iVar12 = binary_op<ncnn::binary_op_sub>(a,pMVar24,this_00,opt);
    return iVar12;
  case 8:
    pMVar24 = a;
    a = pMVar1;
LAB_003648cf:
    iVar12 = binary_op<ncnn::binary_op_div>(a,pMVar24,this_00,opt);
    return iVar12;
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);

    return 0;
}